

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O0

void enableCursor(_GLFWwindow *window)

{
  _GLFWwindow *window_local;
  
  if (window->rawMouseMotion != 0) {
    disableRawMouseMotion(window);
  }
  _glfw.x11.disabledCursorWindow = (_GLFWwindow *)0x0;
  (*_glfw.x11.xlib.UngrabPointer)(_glfw.x11.display,0);
  _glfwSetCursorPosX11(window,_glfw.x11.restoreCursorPosX,_glfw.x11.restoreCursorPosY);
  updateCursorImage(window);
  return;
}

Assistant:

static void enableCursor(_GLFWwindow* window)
{
    if (window->rawMouseMotion)
        disableRawMouseMotion(window);

    _glfw.x11.disabledCursorWindow = NULL;
    XUngrabPointer(_glfw.x11.display, CurrentTime);
    _glfwSetCursorPosX11(window,
                         _glfw.x11.restoreCursorPosX,
                         _glfw.x11.restoreCursorPosY);
    updateCursorImage(window);
}